

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateVirtualTableUpdate
          (ExpressionContext *ctx,SynBase *source,VariableData *vtable,
          SmallArray<FunctionData_*,_32U> *functionSet,SmallArray<TypeClass_*,_32U> *classTypes)

{
  TypeFunction *pTVar1;
  TypeBase *pTVar2;
  ModuleData *pMVar3;
  FunctionData *type_00;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  TypeBase **ppTVar8;
  ExprBase *pEVar9;
  undefined4 extraout_var;
  ExprBase *node;
  _func_int **pp_Var10;
  FunctionData **ppFVar11;
  char *pcVar12;
  TypeClass **ppTVar13;
  undefined4 extraout_var_02;
  uint i;
  uint uVar14;
  uint i_3;
  SmallArray<TypeClass_*,_32U> *this;
  FunctionData *pFVar15;
  InplaceStr name_00;
  FunctionData *function;
  TypeBase *type;
  SynBase *local_3a8;
  SmallArray<TypeClass_*,_32U> *local_3a0;
  IntrusiveList<ExprBase> expressions;
  InplaceStr name;
  TraceScope traceScope;
  SmallArray<FunctionData_*,_32U> functions;
  SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U> assignments;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  local_3a8 = source;
  local_3a0 = classTypes;
  if ((CreateVirtualTableUpdate(ExpressionContext&,SynBase*,VariableData*,SmallArray<FunctionData*,int>&,SmallArray<TypeClass*,int>&)
       ::token == '\0') &&
     (iVar5 = __cxa_guard_acquire(&CreateVirtualTableUpdate(ExpressionContext&,SynBase*,VariableData*,SmallArray<FunctionData*,int>&,SmallArray<TypeClass*,int>&)
                                   ::token), iVar5 != 0)) {
    CreateVirtualTableUpdate::token = NULLC::TraceGetToken("analyze","CreateVirtualTableUpdate");
    __cxa_guard_release(&CreateVirtualTableUpdate(ExpressionContext&,SynBase*,VariableData*,SmallArray<FunctionData*,int>&,SmallArray<TypeClass*,int>&)
                         ::token);
    source = local_3a8;
  }
  NULLC::TraceScope::TraceScope(&traceScope,CreateVirtualTableUpdate::token);
  expressions.head = (ExprBase *)0x0;
  expressions.tail = (ExprBase *)0x0;
  pcVar12 = (vtable->name->name).begin;
  name.begin = pcVar12 + 0xf;
  sVar6 = strlen(name.begin);
  name.end = pcVar12 + sVar6 + 0xf;
  uVar14 = 0;
  uVar7 = strtoul(pcVar12 + 5,(char **)0x0,10);
  do {
    if ((ctx->types).count <= uVar14) {
LAB_00169681:
      anon_unknown.dwarf_94284::Stop
                (ctx,source,"ERROR: Can\'t find function type for virtual function table \'%.*s\'",
                 (ulong)(uint)(*(int *)&(vtable->name->name).end - (int)(vtable->name->name).begin))
      ;
    }
    ppTVar8 = SmallArray<TypeBase_*,_128U>::operator[](&ctx->types,uVar14);
    if ((*ppTVar8)->nameHash == (uint)uVar7) {
      ppTVar8 = SmallArray<TypeBase_*,_128U>::operator[](&ctx->types,uVar14);
      pTVar1 = (TypeFunction *)*ppTVar8;
      if ((pTVar1 != (TypeFunction *)0x0) && ((pTVar1->super_TypeBase).typeID == 0x15)) {
        if (vtable->importModule == (ModuleData *)0x0) {
          name_00.end = "";
          name_00.begin = "__typeCount";
          pEVar9 = CreateFunctionCall0(ctx,source,name_00,false,true,true);
          pEVar9 = CreateArrayAllocation(ctx,source,ctx->typeFunctionID,pEVar9);
          iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          ExprVariableAccess::ExprVariableAccess
                    ((ExprVariableAccess *)CONCAT44(extraout_var,iVar5),source,vtable->type,vtable);
          pEVar9 = CreateAssignment(ctx,source,(ExprBase *)CONCAT44(extraout_var,iVar5),pEVar9);
          iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          node = (ExprBase *)CONCAT44(extraout_var_00,iVar5);
          pTVar2 = ctx->typeVoid;
          iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
          pp_Var10 = (_func_int **)CONCAT44(extraout_var_01,iVar5);
          *pp_Var10 = (_func_int *)0x0;
          pp_Var10[1] = (_func_int *)vtable;
          pp_Var10[2] = (_func_int *)0x0;
          *(undefined1 *)(pp_Var10 + 3) = 0;
          node->typeID = 0x1e;
          node->source = source;
          node->type = pTVar2;
          node->next = (ExprBase *)0x0;
          node->listed = false;
          node->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a58;
          node[1]._vptr_ExprBase = pp_Var10;
          *(ExprBase **)&node[1].typeID = pEVar9;
          IntrusiveList<ExprBase>::push_back(&expressions,node);
        }
        functions.allocator = ctx->allocator;
        functions.data = functions.little;
        functions.count = 0;
        functions.max = 0x20;
        this = local_3a0;
        for (uVar14 = 0; uVar14 < functionSet->count; uVar14 = uVar14 + 1) {
          ppFVar11 = SmallArray<FunctionData_*,_32U>::operator[](functionSet,uVar14);
          function = *ppFVar11;
          pMVar3 = function->scope->ownerType->importModule;
          if (((pMVar3 == (ModuleData *)0x0) || (pMVar3 != vtable->importModule)) &&
             (function->type == pTVar1)) {
            pcVar12 = strstr((function->name->name).begin,"::");
            assignments._0_8_ = pcVar12 + 2;
            sVar6 = strlen((char *)assignments._0_8_);
            this = local_3a0;
            assignments.data = (Node *)(pcVar12 + sVar6 + 2);
            bVar4 = InplaceStr::operator==((InplaceStr *)&assignments,&name);
            if (bVar4) {
              SmallArray<FunctionData_*,_32U>::push_back(&functions,&function);
            }
          }
        }
        SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U>::SmallDenseMap
                  (&assignments,ctx->allocator);
        for (uVar14 = 0; uVar14 < functions.count; uVar14 = uVar14 + 1) {
          ppFVar11 = SmallArray<FunctionData_*,_32U>::operator[](&functions,uVar14);
          function = *ppFVar11;
          type = function->scope->ownerType;
          pEVar9 = CreateVirtualTableAssignment(ctx,source,vtable,type,function);
          IntrusiveList<ExprBase>::push_back(&expressions,pEVar9);
          if ((type != (TypeBase *)0x0) && (type->typeID == 0x18)) {
            SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U>::insert
                      (&assignments,&type,&function);
          }
        }
        uVar14 = 0;
        do {
          if (this->count <= uVar14) {
            iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
            pEVar9 = (ExprBase *)CONCAT44(extraout_var_02,iVar5);
            pTVar2 = ctx->typeVoid;
            pEVar9->typeID = 0x36;
            pEVar9->source = source;
            pEVar9->type = pTVar2;
            pEVar9->next = (ExprBase *)0x0;
            pEVar9->listed = false;
            pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002240b0;
            pEVar9[1]._vptr_ExprBase = (_func_int **)expressions.head;
            *(ExprBase **)&pEVar9[1].typeID = expressions.tail;
            pEVar9[1].source = (SynBase *)0x0;
            SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U>::~SmallDenseMap
                      (&assignments);
            SmallArray<FunctionData_*,_32U>::~SmallArray(&functions);
            NULLC::TraceScope::~TraceScope(&traceScope);
            return pEVar9;
          }
          ppTVar13 = SmallArray<TypeClass_*,_32U>::operator[](this,uVar14);
          type_00 = (FunctionData *)*ppTVar13;
          function = type_00;
          ppFVar11 = SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U>::find
                               (&assignments,(TypeBase **)&function);
          pFVar15 = type_00;
          if (ppFVar11 == (FunctionData **)0x0) {
            do {
              pFVar15 = *(FunctionData **)&(pFVar15->arguments).little[3].isExplicit;
              if (pFVar15 == (FunctionData *)0x0) goto LAB_001695f0;
              function = pFVar15;
              ppFVar11 = SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U>::find
                                   (&assignments,(TypeBase **)&function);
            } while (ppFVar11 == (FunctionData **)0x0);
            function = *ppFVar11;
            pEVar9 = CreateVirtualTableAssignment(ctx,local_3a8,vtable,(TypeBase *)type_00,function)
            ;
            IntrusiveList<ExprBase>::push_back(&expressions,pEVar9);
            type = (TypeBase *)type_00;
            SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U>::insert
                      (&assignments,&type,&function);
          }
LAB_001695f0:
          uVar14 = uVar14 + 1;
          this = local_3a0;
          source = local_3a8;
        } while( true );
      }
      goto LAB_00169681;
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

ExprBase* CreateVirtualTableUpdate(ExpressionContext &ctx, SynBase *source, VariableData *vtable, SmallArray<FunctionData*, 32> &functionSet, SmallArray<TypeClass*, 32> &classTypes)
{
	TRACE_SCOPE("analyze", "CreateVirtualTableUpdate");

	IntrusiveList<ExprBase> expressions;

	// Find function name
	InplaceStr name = InplaceStr(vtable->name->name.begin + 15); // 15 to skip $vtbl0123456789 from name

	// Find function type from name
	unsigned typeNameHash = strtoul(vtable->name->name.begin + 5, NULL, 10);

	TypeBase *functionType = NULL;

	for(unsigned i = 0; i < ctx.types.size(); i++)
	{
		if(ctx.types[i]->nameHash == typeNameHash)
		{
			functionType = getType<TypeFunction>(ctx.types[i]);
			break;
		}
	}

	if(!functionType)
		Stop(ctx, source, "ERROR: Can't find function type for virtual function table '%.*s'", FMT_ISTR(vtable->name->name));

	if(vtable->importModule == NULL)
	{
		ExprBase *count = CreateFunctionCall0(ctx, source, InplaceStr("__typeCount"), false, true, true);

		ExprBase *alloc = CreateArrayAllocation(ctx, source, ctx.typeFunctionID, count);

		ExprBase *assignment = CreateAssignment(ctx, source, new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(source, vtable->type, vtable), alloc);

		expressions.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(source, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, vtable), assignment));
	}

	// Find all functions with called name that are member functions and have target type
	SmallArray<FunctionData*, 32> functions(ctx.allocator);

	for(unsigned i = 0; i < functionSet.size(); i++)
	{
		FunctionData *function = functionSet[i];

		TypeBase *parentType = function->scope->ownerType;

		// If both type and table are imported, then it should have been filled up inside the module for that type
		if(parentType->importModule && vtable->importModule && parentType->importModule == vtable->importModule)
			continue;

		if(function->type != functionType)
			continue;

		const char *pos = strstr(function->name->name.begin, "::");

		if(InplaceStr(pos + 2) == name)
			functions.push_back(function);
	}

	SmallDenseMap<TypeBase*, FunctionData*, TypeBaseHasher, 32> assignments(ctx.allocator);

	// Handle direct assignments
	for(unsigned i = 0; i < functions.size(); i++)
	{
		FunctionData *function = functions[i];
		TypeBase *type = function->scope->ownerType;

		expressions.push_back(CreateVirtualTableAssignment(ctx, source, vtable, type, function));

		// Record that owner type recevied an assignment to this function
		if(isType<TypeClass>(type))
			assignments.insert(type, function);
	}

	// Handle derived classes
	for(unsigned i = 0; i < classTypes.size(); i++)
	{
		TypeClass *type = classTypes[i];

		// Already assigned
		if(assignments.find(type))
			continue;

		// Not assigned directly, walk through base classes
		for(TypeClass *curr = type->baseClass; curr; curr = curr->baseClass)
		{
			if(FunctionData **assignment = assignments.find(curr))
			{
				FunctionData *function = *assignment;

				expressions.push_back(CreateVirtualTableAssignment(ctx, source, vtable, type, function));

				assignments.insert(type, function);
				break;
			}
		}
	}

	return new (ctx.get<ExprBlock>()) ExprBlock(source, ctx.typeVoid, expressions, NULL);
}